

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kpagent.c
# Opt level: O3

kp_error_t kp_agent_store(kp_agent *agent,kp_unsafe *unsafe)

{
  kp_agent *agent_00;
  storage sVar1;
  uint uVar2;
  kp_agent_safe *__s1;
  char *pcVar3;
  ulong uVar4;
  kp_store *pkVar5;
  int *piVar6;
  kp_store *pkVar7;
  kp_store *pkVar8;
  kp_store *pkVar9;
  kp_agent *safe;
  kp_store *pkVar10;
  storage *psVar11;
  kp_store *pkVar12;
  
  __s1 = (kp_agent_safe *)malloc(0x1010);
  if (__s1 != (kp_agent_safe *)0x0) {
    pcVar3 = (char *)sodium_malloc(0x1000);
    __s1->password = pcVar3;
    pcVar3 = (char *)sodium_malloc(0x1000);
    __s1->metadata = pcVar3;
    uVar4 = strlcpy(__s1,unsafe->name,0x1000);
    if ((((uVar4 < 0x1000) &&
         (uVar4 = strlcpy(__s1->password,unsafe->password,0x1000), uVar4 < 0x1000)) &&
        (uVar4 = strlcpy(__s1->metadata,unsafe->metadata,0x1000), uVar4 < 0x1000)) &&
       (pkVar5 = (kp_store *)malloc(0x28), pkVar5 != (kp_store *)0x0)) {
      pkVar5->safe = __s1;
      sVar1 = storage;
      if (storage.rbh_root == (kp_store *)0x0) {
        (pkVar5->tree).rbe_left = (kp_store *)0x0;
        (pkVar5->tree).rbe_right = (kp_store *)0x0;
        (pkVar5->tree).rbe_parent = (kp_store *)0x0;
        (pkVar5->tree).rbe_color = 1;
        storage.rbh_root = pkVar5;
      }
      else {
        do {
          pkVar12 = sVar1.rbh_root;
          agent_00 = (kp_agent *)pkVar12->safe;
          safe = agent_00;
          uVar2 = strncmp((char *)__s1,(char *)agent_00,0x1000);
          pkVar7 = pkVar12;
          if (-1 < (int)uVar2) {
            if (uVar2 == 0) {
              kp_agent_safe_free(agent_00,(kp_agent_safe *)safe);
              pkVar12->safe = __s1;
              return 0;
            }
            pkVar7 = (kp_store *)&(pkVar12->tree).rbe_right;
          }
          sVar1.rbh_root = (pkVar7->tree).rbe_left;
        } while (sVar1.rbh_root != (kp_store *)0x0);
        (pkVar5->tree).rbe_parent = pkVar12;
        (pkVar5->tree).rbe_left = (kp_store *)0x0;
        (pkVar5->tree).rbe_right = (kp_store *)0x0;
        (pkVar5->tree).rbe_color = 1;
        (&(pkVar12->tree).rbe_left)[~uVar2 >> 0x1f] = pkVar5;
        do {
          if ((pkVar12->tree).rbe_color != 1) break;
          pkVar7 = (pkVar12->tree).rbe_parent;
          pkVar9 = (pkVar7->tree).rbe_left;
          if (pkVar12 == pkVar9) {
            pkVar8 = (pkVar7->tree).rbe_right;
            if ((pkVar8 != (kp_store *)0x0) && ((pkVar8->tree).rbe_color == 1)) {
              (pkVar8->tree).rbe_color = 0;
              goto LAB_0010515f;
            }
            pkVar8 = (pkVar12->tree).rbe_right;
            pkVar10 = pkVar12;
            if (pkVar8 == pkVar5) {
              pkVar9 = (pkVar8->tree).rbe_left;
              (pkVar12->tree).rbe_right = pkVar9;
              if (pkVar9 == (kp_store *)0x0) {
                (pkVar8->tree).rbe_parent = pkVar7;
                pkVar9 = (pkVar12->tree).rbe_parent;
LAB_00105241:
                psVar11 = (storage *)
                          (&(pkVar9->tree).rbe_left + (pkVar12 != (pkVar9->tree).rbe_left));
              }
              else {
                (pkVar9->tree).rbe_parent = pkVar12;
                pkVar9 = (pkVar12->tree).rbe_parent;
                (pkVar8->tree).rbe_parent = pkVar9;
                psVar11 = &storage;
                if (pkVar9 != (kp_store *)0x0) goto LAB_00105241;
              }
              *psVar11 = (storage)pkVar8;
              (pkVar8->tree).rbe_left = pkVar12;
              (pkVar12->tree).rbe_parent = pkVar8;
              pkVar9 = (pkVar7->tree).rbe_left;
              pkVar10 = pkVar5;
              pkVar5 = pkVar12;
            }
            (pkVar10->tree).rbe_color = 0;
            (pkVar7->tree).rbe_color = 1;
            pkVar12 = (pkVar9->tree).rbe_right;
            (pkVar7->tree).rbe_left = pkVar12;
            if (pkVar12 != (kp_store *)0x0) {
              (pkVar12->tree).rbe_parent = pkVar7;
            }
            pkVar12 = (pkVar7->tree).rbe_parent;
            (pkVar9->tree).rbe_parent = pkVar12;
            psVar11 = &storage;
            if (pkVar12 != (kp_store *)0x0) {
              psVar11 = (storage *)
                        (&(pkVar12->tree).rbe_left + (pkVar7 != (pkVar12->tree).rbe_left));
            }
            *psVar11 = (storage)pkVar9;
            (pkVar9->tree).rbe_right = pkVar7;
LAB_001052a0:
            (pkVar7->tree).rbe_parent = pkVar9;
          }
          else {
            if ((pkVar9 == (kp_store *)0x0) || ((pkVar9->tree).rbe_color != 1)) {
              pkVar9 = (pkVar12->tree).rbe_left;
              pkVar8 = pkVar12;
              if (pkVar9 == pkVar5) {
                pkVar8 = (pkVar9->tree).rbe_right;
                (pkVar12->tree).rbe_left = pkVar8;
                if (pkVar8 == (kp_store *)0x0) {
                  (pkVar9->tree).rbe_parent = pkVar7;
                  pkVar8 = (pkVar12->tree).rbe_parent;
LAB_001051d7:
                  psVar11 = (storage *)
                            (&(pkVar8->tree).rbe_left + (pkVar12 != (pkVar8->tree).rbe_left));
                }
                else {
                  (pkVar8->tree).rbe_parent = pkVar12;
                  pkVar8 = (pkVar12->tree).rbe_parent;
                  (pkVar9->tree).rbe_parent = pkVar8;
                  psVar11 = &storage;
                  if (pkVar8 != (kp_store *)0x0) goto LAB_001051d7;
                }
                *psVar11 = (storage)pkVar9;
                (pkVar9->tree).rbe_right = pkVar12;
                (pkVar12->tree).rbe_parent = pkVar9;
                pkVar8 = pkVar5;
                pkVar5 = pkVar12;
              }
              (pkVar8->tree).rbe_color = 0;
              (pkVar7->tree).rbe_color = 1;
              pkVar9 = (pkVar7->tree).rbe_right;
              pkVar12 = (pkVar9->tree).rbe_left;
              (pkVar7->tree).rbe_right = pkVar12;
              if (pkVar12 != (kp_store *)0x0) {
                (pkVar12->tree).rbe_parent = pkVar7;
              }
              pkVar12 = (pkVar7->tree).rbe_parent;
              (pkVar9->tree).rbe_parent = pkVar12;
              psVar11 = &storage;
              if (pkVar12 != (kp_store *)0x0) {
                psVar11 = (storage *)
                          (&(pkVar12->tree).rbe_left + (pkVar7 != (pkVar12->tree).rbe_left));
              }
              *psVar11 = (storage)pkVar9;
              (pkVar9->tree).rbe_left = pkVar7;
              goto LAB_001052a0;
            }
            (pkVar9->tree).rbe_color = 0;
LAB_0010515f:
            (pkVar12->tree).rbe_color = 0;
            (pkVar7->tree).rbe_color = 1;
            pkVar5 = pkVar7;
          }
          pkVar12 = (pkVar5->tree).rbe_parent;
        } while (pkVar12 != (kp_store *)0x0);
      }
      ((storage.rbh_root)->tree).rbe_color = 0;
      return 0;
    }
  }
  piVar6 = __errno_location();
  *piVar6 = 0xc;
  return 5;
}

Assistant:

kp_error_t
kp_agent_store(struct kp_agent *agent, struct kp_unsafe *unsafe)
{
	kp_error_t ret;
	struct kp_store *store, *existing;
	struct kp_agent_safe *safe;

	if ((ret = kp_agent_safe_create(agent, &safe)) != KP_SUCCESS) {
		return ret;
	}

	if (strlcpy(safe->name, unsafe->name, PATH_MAX) >= PATH_MAX) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->password, unsafe->password, KP_PASSWORD_MAX_LEN)
	    >= KP_PASSWORD_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}
	if (strlcpy(safe->metadata, unsafe->metadata, KP_METADATA_MAX_LEN)
	    >= KP_METADATA_MAX_LEN) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	if ((store = malloc(sizeof(struct kp_store))) == NULL) {
		errno = ENOMEM;
		ret = KP_ERRNO;
		goto out;
	}

	store->safe = safe;

	existing = RB_INSERT(storage, &storage, store);
	if (existing != NULL) {
		kp_agent_safe_free(agent, existing->safe);
		existing->safe = safe;
	}

	ret = KP_SUCCESS;

out:
	return ret;
}